

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O3

QAuthenticator * __thiscall QAuthenticator::operator=(QAuthenticator *this,QAuthenticator *other)

{
  QAuthenticatorPrivate *pQVar1;
  QAuthenticatorPrivate *pQVar2;
  
  if (this->d != other->d) {
    detach(this);
    pQVar1 = this->d;
    if (other->d == (QAuthenticatorPrivate *)0x0) {
      if (pQVar1->phase == Start) {
        QAuthenticatorPrivate::~QAuthenticatorPrivate(pQVar1);
        operator_delete(pQVar1,0xe8);
        this->d = (QAuthenticatorPrivate *)0x0;
      }
    }
    else {
      QString::operator=(&pQVar1->user,(QString *)other->d);
      QString::operator=(&this->d->userDomain,(QString *)&other->d->userDomain);
      QString::operator=(&this->d->workstation,(QString *)&other->d->workstation);
      QString::operator=(&this->d->extractedUser,(QString *)&other->d->extractedUser);
      QString::operator=(&this->d->password,(QString *)&other->d->password);
      QString::operator=(&this->d->realm,(QString *)&other->d->realm);
      pQVar1 = other->d;
      pQVar2 = this->d;
      pQVar2->method = pQVar1->method;
      QHash<QString,_QVariant>::operator=(&pQVar2->options,&pQVar1->options);
    }
  }
  return this;
}

Assistant:

QAuthenticator &QAuthenticator::operator=(const QAuthenticator &other)
{
    if (d == other.d)
        return *this;

    // Do not share the d since challenge response/based changes
    // could corrupt the internal store and different network requests
    // can utilize different types of proxies.
    detach();
    if (other.d) {
        d->user = other.d->user;
        d->userDomain = other.d->userDomain;
        d->workstation = other.d->workstation;
        d->extractedUser = other.d->extractedUser;
        d->password = other.d->password;
        d->realm = other.d->realm;
        d->method = other.d->method;
        d->options = other.d->options;
    } else if (d->phase == QAuthenticatorPrivate::Start) {
        delete d;
        d = nullptr;
    }
    return *this;
}